

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall
level_mesh::change_tag
          (level_mesh *this,uint32_t tag,uint32_t min_face,uint32_t max_face,uint32_t new_tag)

{
  uint32_t uVar1;
  bool bVar2;
  pointer pbVar3;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_48;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_40;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_38;
  b_face_vec_it end;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_28;
  b_face_vec_it it;
  uint32_t new_tag_local;
  uint32_t max_face_local;
  uint32_t min_face_local;
  uint32_t tag_local;
  level_mesh *this_local;
  
  it._M_current._0_4_ = new_tag;
  it._M_current._4_4_ = max_face;
  end._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&(this->super_xr_mesh_builder).m_faces);
  local_28 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator+(&end,(ulong)min_face);
  local_48._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&(this->super_xr_mesh_builder).m_faces);
  local_40 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator+(&local_48,(ulong)it._M_current._4_4_);
  local_38 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator+(&local_40,1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar2) break;
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&local_28);
    uVar1 = (uint32_t)it._M_current;
    if (pbVar3->tag == tag) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator->(&local_28);
      pbVar3->tag = uVar1;
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void level_mesh::change_tag(uint32_t tag, uint32_t min_face, uint32_t max_face, uint32_t new_tag)
{
	for (b_face_vec_it it = m_faces.begin() + min_face,
			end = m_faces.begin() + max_face + 1; it != end; ++it) {
		if (it->tag == tag)
			it->tag = new_tag;
	}
}